

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_xml_repeat_tests.cpp
# Opt level: O2

void __thiscall
iu_TestF_x_iutest_x_XmlFilePath_Test::Body(iu_TestF_x_iutest_x_XmlFilePath_Test *this)

{
  Variable *pVVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_2d0;
  Fixed local_2a0;
  char expect [256];
  
  iutest::detail::iu_snprintf(expect,0x100,"test_%d.xml",(ulong)(uint)TestF::nI);
  pVVar1 = iutest::TestEnv::get_vars();
  iutest::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (&iutest_ar,(internal *)"expect",
             "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath())"
             ,expect,(char (*) [256])((pVVar1->m_event_listeners).m_default_xml_generator + 5),in_R9
            );
  if (iutest_ar.m_result == false) {
    memset(&local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_xml_repeat_tests.cpp"
               ,0x30,iutest_ar.m_message._M_dataplus._M_p);
    local_2d0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2d0,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_F(TestF, XmlFilePath)
{
    char expect[256];
    ::iutest::detail::iu_snprintf(expect, sizeof(expect), "test_%d.xml", nI);
    IUTEST_ASSERT_EQ( expect
        , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath()) );
}